

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O2

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  mapped_type *pmVar6;
  long in_RCX;
  long *plVar7;
  key_type local_38;
  
  plVar7 = (long *)timeout.tv_sec;
  DataBlob::DataBlob((DataBlob *)this);
  if (*plVar7 != 0) {
    lVar4 = std::chrono::_V2::system_clock::now();
    do {
      lVar1 = *plVar7;
      std::mutex::lock((mutex *)&((pthread_mutex_t *)(lVar1 + 0xd8))->__data);
      lVar2 = *plVar7;
      lVar3 = *(long *)(lVar2 + 0x100);
      lVar5 = std::chrono::_V2::system_clock::now();
      pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0xd8));
      if (lVar3 != lVar2 + 0x100) {
        lVar4 = *plVar7;
        std::mutex::lock((mutex *)&((pthread_mutex_t *)(lVar4 + 0xd8))->__data);
        DataBlob::operator=((DataBlob *)this,(DataBlob *)(*(long *)(*plVar7 + 0x100) + 0x10));
        std::__cxx11::list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::
        pop_front((list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_> *)
                  (*plVar7 + 0x100));
        lVar1 = *plVar7;
        local_38._M_thread = pthread_self();
        pmVar6 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                               *)(lVar1 + 0x38),&local_38);
        *pmVar6 = 0;
        pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 0xd8));
        return (DataBlob)(DataBlob_private *)this;
      }
    } while ((double)((float)(lVar5 - lVar4) / 1e+09) <
             (double)in_RCX / 1000000.0 + (double)timeout.tv_usec);
    lVar4 = *plVar7;
    local_38._M_thread = pthread_self();
    pmVar6 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(lVar4 + 0x38),&local_38);
    *pmVar6 = 1;
  }
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob ret;
      if (!m_private) {
        return ret;
      }

      // Keep checking for a new blob until we either find one or time out.
      bool empty;
      double timeoutSeconds = timeout.tv_sec + timeout.tv_usec / 1e6;
      std::chrono::duration<float> dt;
      auto start = std::chrono::system_clock::now();
      do {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        empty = m_private->storedBlobs.empty();
        auto now = std::chrono::system_clock::now();
        dt = now - start;
      } while (empty && (dt.count() < timeoutSeconds));

      if (!empty) {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        ret = m_private->storedBlobs.front();
        m_private->storedBlobs.pop_front();
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
      } else {
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_TIMEOUT;
      }

      return ret;
    }